

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int bitstream_w_write(bitstream_w *stream,uint64_t src,int32_t bits)

{
  byte *pbVar1;
  ulong uVar2;
  void *pvVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  
  if (0 < bits) {
    if (0x38 < (uint)bits) {
      return -1;
    }
    uVar2 = stream->bit_offset;
    uVar6 = (ulong)((int)uVar2 + bits + 7U >> 3);
    if (stream->length < uVar6) {
      return -1;
    }
    pvVar3 = stream->ptr;
    stream->bit_offset = (uint)bits + uVar2;
    uVar8 = (int)uVar2 + bits & 7;
    bVar7 = (byte)uVar8;
    bVar4 = 8 - bVar7;
    if (uVar8 == 0) {
      bVar4 = bVar7;
    }
    uVar5 = (~(-1L << ((byte)bits & 0x3f)) & src) << (bVar4 & 0x3f);
    for (; (uVar2 >> 3 & 0x1fffffff) != uVar6; uVar6 = uVar6 - 1) {
      pbVar1 = (byte *)((long)pvVar3 + (uVar6 - 1));
      *pbVar1 = *pbVar1 | (byte)uVar5;
      uVar5 = uVar5 >> 8;
    }
  }
  return 0;
}

Assistant:

int
bitstream_w_write(struct bitstream_w *stream, uint64_t src, int32_t bits) {
  uint32_t bit_start, bit_end;
  size_t offset, size;
  uint8_t *buffer;

  if (bits <= 0) {
    return 0;
  }

  if (bits > 56) {
    return -1;
  }

  buffer = stream->ptr;

  /* copy range */
  bit_start = stream->bit_offset;
  bit_end = bit_start + bits;

  /* calculate offset */
  offset = bit_start / 8;
  size = (bit_end + 7) / 8 - offset;

  /* check range */
  if (offset + size > stream->length) {
    return -1;
  }

  /* advance pointer */
  stream->bit_offset += bits;

  /* mask input */
  src &= ((1ull << bits) - 1ull);

  /* shift source value */
  bit_end = bit_end & 7;
  if (bit_end != 0) {
    src <<= (8 - bit_end);
  }

  /* write data to buffer */
  while (size > 0) {
    size--;

    buffer[offset + size] |= (src & 0xFF);
    src >>= 8;
  }

  return 0;
}